

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

uint64_t rdr_mapobs(rdr_t *rdr,char *str)

{
  qrk_t *qrk;
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  uint64_t uVar4;
  undefined8 uStack_30;
  
  if (rdr->autouni != false) {
    uStack_30 = 0x10de49;
    sVar2 = strlen(str);
    uVar3 = sVar2 + 0x11 & 0xfffffffffffffff0;
    lVar1 = -uVar3;
    (&stack0xffffffffffffffd8)[-uVar3] = 0x75;
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10de73;
    strcpy(&stack0xffffffffffffffd9 + lVar1,str);
    qrk = rdr->obs;
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10de7f;
    uVar4 = qrk_str2id(qrk,&stack0xffffffffffffffd8 + lVar1);
    return uVar4;
  }
  uVar4 = qrk_str2id(rdr->obs,str);
  return uVar4;
}

Assistant:

static uint64_t rdr_mapobs(rdr_t *rdr, const char *str) {
	if (!rdr->autouni)
		return qrk_str2id(rdr->obs, str);
	char tmp[strlen(str) + 2];
	tmp[0] = 'u';
	strcpy(tmp + 1, str);
	return qrk_str2id(rdr->obs, tmp);
}